

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derDec3(octet **val,octet *der,size_t count,u32 tag,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  u32 t;
  size_t l;
  u32 local_2c;
  size_t local_28;
  
  sVar1 = derDec(&local_2c,val,&local_28,der,count);
  sVar2 = 0xffffffffffffffff;
  if (local_28 == len) {
    sVar2 = sVar1;
  }
  if (local_2c != tag) {
    sVar2 = 0xffffffffffffffff;
  }
  if (sVar1 != 0xffffffffffffffff) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

size_t derDec3(const octet** val, const octet der[], size_t count,
	u32 tag, size_t len)
{
	u32 t;
	size_t l;
	count = derDec(&t, val, &l, der, count);
	if (count == SIZE_MAX || t != tag || l != len)
		return SIZE_MAX;
	return count;
}